

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

uint64_t sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)0>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)0> *div)

{
  uint32_t *puVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  uint32_t *puVar5;
  uint64_t uVar6;
  int32_t yl;
  short sVar7;
  short sVar8;
  byte bVar9;
  ushort uVar10;
  size_t loop;
  long lVar11;
  undefined1 auVar12 [64];
  __m512i sumX4;
  type_pun_vec result;
  undefined1 local_140 [64];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [2] [64];
  
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  local_140 = vmovdqa64_avx512f(auVar12);
  sVar3 = (div->div).denom.magic;
  bVar2 = (div->div).denom.more;
  puVar5 = vals->_pData;
  puVar1 = (uint32_t *)((long)puVar5 + (ulong)vals->_length * 2);
  bVar9 = bVar2 & 0x1f;
  uVar10 = 0xffff;
  if (-1 < (char)bVar2) {
    uVar10 = 0;
  }
  while (puVar5 != puVar1) {
    local_100 = *(undefined8 *)puVar5;
    uStack_f8 = *(undefined8 *)(puVar5 + 2);
    uStack_f0 = *(undefined8 *)(puVar5 + 4);
    uStack_e8 = *(undefined8 *)(puVar5 + 6);
    uStack_e0 = *(undefined8 *)(puVar5 + 8);
    uStack_d8 = *(undefined8 *)(puVar5 + 10);
    uStack_d0 = *(undefined8 *)(puVar5 + 0xc);
    uStack_c8 = *(undefined8 *)(puVar5 + 0xe);
    for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
      uVar4 = *(ushort *)((long)&local_100 + lVar11 * 2);
      if (sVar3 == 0) {
        sVar8 = ((ushort)((int)(short)(((ushort)((uint)(int)(short)uVar4 >> 0xf) &
                                       ~(ushort)(-1 << bVar9)) + uVar4) >> bVar9) ^ uVar10) - uVar10
        ;
      }
      else {
        sVar7 = (short)((uint)((int)(short)uVar4 * (int)sVar3) >> 0x10);
        sVar8 = (sVar7 - ((char)bVar2 >> 7)) + (uVar4 ^ (short)((char)bVar2 >> 7));
        if ((bVar2 & 0x40) == 0) {
          sVar8 = sVar7;
        }
        sVar8 = (short)((int)sVar8 >> bVar9) - (sVar8 >> 0xf);
      }
      *(short *)(local_c0[0] + lVar11 * 2) = sVar8;
    }
    auVar12 = vpaddw_avx512bw(auVar12,local_c0[0]);
    puVar5 = puVar5 + 0x10;
    local_140 = vmovdqa64_avx512f(auVar12);
  }
  uVar6 = unsigned_sum_vals<short>((short *)local_140,0x20);
  return uVar6;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}